

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

void __thiscall
license::EventRegistry::addEvent(EventRegistry *this,EVENT_TYPE event,SEVERITY severity)

{
  undefined1 local_220 [8];
  AuditEvent audit;
  SEVERITY severity_local;
  EVENT_TYPE event_local;
  EventRegistry *this_local;
  
  audit.severity._0_1_ = SVRT_INFO;
  audit.param1[0xf8] = '\0';
  local_220._0_4_ = severity;
  local_220._4_4_ = event;
  audit.param2._248_4_ = severity;
  audit.param2._252_4_ = event;
  std::vector<AuditEvent,_std::allocator<AuditEvent>_>::push_back
            (&this->logs,(value_type *)local_220);
  return;
}

Assistant:

void EventRegistry::addEvent(EVENT_TYPE event, SEVERITY severity) {
	AuditEvent audit;
	audit.severity = severity;
	audit.event_type = event;
	audit.param1[0] = '\0';
	audit.param2[0] = '\0';
	logs.push_back(audit);
}